

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

Ref<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_> __thiscall
pybind11::detail::
argument_loader<anurbs::Model&,std::shared_ptr<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>>,std::__cxx11::string_const&>
::
call_impl<anurbs::Ref<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>>,anurbs::Ref<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>>(*&)(anurbs::Model&,std::shared_ptr<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>>,std::__cxx11::string_const&),0ul,1ul,2ul,pybind11::detail::void_type>
          (argument_loader<anurbs::Model&,std::shared_ptr<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>>,std::__cxx11::string_const&>
           *this,long f,undefined8 *param_3)

{
  code *pcVar1;
  itype *piVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Ref<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_> RVar4;
  undefined8 local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  pcVar1 = (code *)*param_3;
  piVar2 = type_caster_base::operator_cast_to_Model_((type_caster_base *)(f + 0x48));
  local_28 = *(undefined8 *)(f + 0x38);
  local_20 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(f + 0x40);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_20->_M_use_count = local_20->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_20->_M_use_count = local_20->_M_use_count + 1;
    }
  }
  (*pcVar1)(this,piVar2,&local_28,f);
  _Var3._M_pi = extraout_RDX;
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    _Var3._M_pi = extraout_RDX_00;
  }
  RVar4.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var3._M_pi;
  RVar4.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (Ref<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>)
         RVar4.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Return call_impl(Func &&f, index_sequence<Is...>, Guard &&) {
        return std::forward<Func>(f)(cast_op<Args>(std::move(std::get<Is>(argcasters)))...);
    }